

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

void __thiscall
boost::shared_ptr<boost::basic_wrap_stringstream<char>>::
shared_ptr<boost::basic_wrap_stringstream<char>>
          (shared_ptr<boost::basic_wrap_stringstream<char>> *this,basic_wrap_stringstream<char> *p)

{
  sp_counted_base *psVar1;
  sp_counted_base *in_RAX;
  shared_count local_18;
  
  *(basic_wrap_stringstream<char> **)this = p;
  *(undefined8 *)(this + 8) = 0;
  local_18.pi_ = in_RAX;
  detail::shared_count::shared_count<boost::basic_wrap_stringstream<char>>(&local_18,p);
  psVar1 = *(sp_counted_base **)(this + 8);
  *(sp_counted_base **)(this + 8) = local_18.pi_;
  local_18.pi_ = psVar1;
  detail::shared_count::~shared_count(&local_18);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }